

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AVLTree.cpp
# Opt level: O2

int __thiscall itis::AVLTree<short>::find(AVLTree<short> *this,short value)

{
  AVLTreeNode<short> *pAVar1;
  int iVar2;
  int iVar3;
  AVLTreeNode<short> *pAVar4;
  
  iVar2 = 0;
  pAVar4 = (AVLTreeNode<short> *)&this->root;
  while( true ) {
    pAVar1 = pAVar4->right;
    if (pAVar1 == (AVLTreeNode<short> *)0x0) {
      return -1;
    }
    if (pAVar1->value == value) break;
    pAVar4 = (AVLTreeNode<short> *)&pAVar1->left;
    if (pAVar1->value <= value) {
      pAVar4 = pAVar1->left;
      iVar3 = 1;
      if (pAVar4 != (AVLTreeNode<short> *)0x0) {
        iVar3 = pAVar4->count + 1;
      }
      iVar2 = iVar2 + iVar3;
      pAVar4 = pAVar1;
    }
  }
  if (pAVar1->left == (AVLTreeNode<short> *)0x0) {
    iVar3 = 0;
  }
  else {
    iVar3 = pAVar1->left->count;
  }
  return iVar3 + iVar2;
}

Assistant:

int AVLTree<T>::find(T value) const {
    AVLTreeNode<T> *direct = root;
    int idx = 0;

    while (direct != nullptr and direct->value != value) {
      if (direct->value > value) {
        direct = direct->left;
      } else {
        idx += (direct->left ? direct->left->count : 0) + 1;
        direct = direct->right;
      }
    }

    if (direct == nullptr) {
      return -1;
    }
    return idx + (direct->left ? direct->left->count : 0);
  }